

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

void __thiscall
deqp::gls::anon_unknown_1::DrawTestShaderProgram::shadeFragments
          (DrawTestShaderProgram *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  int fragNdx_00;
  int packetNdx_00;
  size_t context_00;
  Vector<float,_4> local_54;
  int local_44;
  FragmentPacket *pFStack_40;
  int fragNdx;
  FragmentPacket *packet;
  undefined8 uStack_30;
  int packetNdx;
  size_t varyingLocColor;
  FragmentShadingContext *context_local;
  FragmentPacket *pFStack_18;
  int numPackets_local;
  FragmentPacket *packets_local;
  DrawTestShaderProgram *this_local;
  
  uStack_30 = 0;
  varyingLocColor = (size_t)context;
  context_local._4_4_ = numPackets;
  pFStack_18 = packets;
  packets_local = (FragmentPacket *)this;
  for (packet._4_4_ = 0; packet._4_4_ < context_local._4_4_; packet._4_4_ = packet._4_4_ + 1) {
    pFStack_40 = pFStack_18 + packet._4_4_;
    for (local_44 = 0; context_00 = varyingLocColor, packetNdx_00 = packet._4_4_,
        fragNdx_00 = local_44, local_44 < 4; local_44 = local_44 + 1) {
      rr::readVarying<float>
                ((rr *)&local_54,pFStack_40,(FragmentShadingContext *)varyingLocColor,0,local_44);
      rr::writeFragmentOutput<tcu::Vector<float,4>>
                ((FragmentShadingContext *)context_00,packetNdx_00,fragNdx_00,0,&local_54);
    }
  }
  return;
}

Assistant:

void DrawTestShaderProgram::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const size_t varyingLocColor = 0;

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		rr::FragmentPacket& packet = packets[packetNdx];

		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, rr::readVarying<float>(packet, context, varyingLocColor, fragNdx));
	}
}